

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWhileCommand.cxx
# Opt level: O2

bool __thiscall
cmWhileFunctionBlocker::Replay
          (cmWhileFunctionBlocker *this,
          vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *functions,
          cmExecutionStatus *inStatus)

{
  cmMakefile *makefile;
  pointer pcVar1;
  pointer pcVar2;
  bool bVar3;
  char cVar4;
  PolicyStatus PVar5;
  string *psVar6;
  cmake *this_00;
  PolicyID id;
  WrapQuotes in_R8D;
  pointer lff;
  cmExpandedCommandArgument *i;
  pointer this_01;
  string_view str;
  MessageType messageType;
  char local_1f9;
  cmWhileFunctionBlocker *local_1f8;
  cmExecutionStatus *local_1f0;
  cmListFileBacktrace whileBT;
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> expandedArguments;
  cmExecutionStatus status;
  string errorString;
  cmConditionEvaluator conditionEvaluator;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_110;
  string local_100;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  cmListFileContext local_a0;
  
  makefile = inStatus->Makefile;
  local_1f0 = inStatus;
  cmMakefile::GetBacktrace((cmMakefile *)&status);
  local_1f8 = this;
  cmListFileContext::cmListFileContext(&local_a0,&(this->super_cmFunctionBlocker).StartingContext);
  cmConstStack<cmListFileContext,_cmListFileBacktrace>::Push
            (&whileBT.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>,
             (cmListFileContext *)&status);
  cmListFileContext::~cmListFileContext(&local_a0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&status.Error);
  expandedArguments.
  super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  expandedArguments.
  super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  expandedArguments.
  super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::reserve
            (&expandedArguments,
             ((long)(local_1f8->Args).
                    super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(local_1f8->Args).
                   super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
                   _M_impl.super__Vector_impl_data._M_start) / 0x30);
  errorString._M_dataplus._M_p = (pointer)&errorString.field_2;
  errorString._M_string_length = 0;
  errorString.field_2._M_local_buf[0] = '\0';
  std::
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_110,
                 (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  *)&whileBT);
  cmConditionEvaluator::cmConditionEvaluator
            (&conditionEvaluator,makefile,(cmListFileBacktrace *)&local_110);
  local_1f8 = (cmWhileFunctionBlocker *)&local_1f8->Args;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_110._M_refcount);
  do {
    std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::clear
              (&expandedArguments);
    cmMakefile::ExpandArguments
              (makefile,(vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)local_1f8
               ,&expandedArguments);
    bVar3 = cmConditionEvaluator::IsTrue
                      (&conditionEvaluator,&expandedArguments,&errorString,&messageType);
    if (!bVar3) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&conditionEvaluator.Backtrace.
                  super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      if (errorString._M_string_length == 0) goto LAB_0025d57b;
      PVar5 = cmMakefile::GetPolicyStatus(makefile,CMP0130,false);
      if (2 < PVar5 - NEW) {
        if (PVar5 != WARN) goto LAB_0025d57b;
        messageType = AUTHOR_WARNING;
      }
      if (errorString._M_string_length != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&status,"while() given incorrect arguments:\n ",
                   (allocator<char> *)&conditionEvaluator);
        pcVar2 = expandedArguments.
                 super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (this_01 = expandedArguments.
                       super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                       ._M_impl.super__Vector_impl_data._M_start; this_01 != pcVar2;
            this_01 = this_01 + 1) {
          std::__cxx11::string::append((char *)&status);
          psVar6 = cmExpandedCommandArgument::GetValue_abi_cxx11_(this_01);
          str._M_str = (char *)0x0;
          str._M_len = (size_t)(psVar6->_M_dataplus)._M_p;
          cmOutputConverter::EscapeForCMake_abi_cxx11_
                    ((string *)&conditionEvaluator,(cmOutputConverter *)psVar6->_M_string_length,str
                     ,in_R8D);
          std::__cxx11::string::append((string *)&status);
          std::__cxx11::string::~string((string *)&conditionEvaluator);
        }
        std::__cxx11::string::append((char *)&status);
        std::__cxx11::string::append((string *)&status);
        PVar5 = cmMakefile::GetPolicyStatus(makefile,CMP0130,false);
        if (PVar5 == WARN) {
          cmPolicies::GetPolicyWarning_abi_cxx11_(&local_100,(cmPolicies *)0x82,id);
          local_1f9 = '\n';
          cmStrCat<std::__cxx11::string,char,std::__cxx11::string&>
                    ((string *)&conditionEvaluator,&local_100,&local_1f9,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&status);
          std::__cxx11::string::operator=((string *)&status,(string *)&conditionEvaluator);
          std::__cxx11::string::~string((string *)&conditionEvaluator);
          std::__cxx11::string::~string((string *)&local_100);
        }
        this_00 = cmMakefile::GetCMakeInstance(makefile);
        cmake::IssueMessage(this_00,messageType,(string *)&status,&whileBT);
        if (messageType == FATAL_ERROR) {
          cmSystemTools::s_FatalErrorOccurred = true;
        }
        std::__cxx11::string::~string((string *)&status);
      }
      goto LAB_0025d57b;
    }
    lff = (functions->super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>).
          _M_impl.super__Vector_impl_data._M_start;
    pcVar1 = (functions->super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    do {
      if (lff == pcVar1) {
        cVar4 = '\x04';
        break;
      }
      cmExecutionStatus::cmExecutionStatus(&status,makefile);
      local_e0._M_engaged = false;
      cmMakefile::ExecuteCommand
                (makefile,lff,&status,
                 (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0);
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_reset(&local_e0);
      if (status.ReturnInvoked == true) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_b8,&status.Variables);
        cmExecutionStatus::SetReturnInvoked(local_1f0,&local_b8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_b8);
LAB_0025d364:
        cVar4 = '\x01';
LAB_0025d369:
        bVar3 = false;
      }
      else {
        if (status.BreakInvoked != false) goto LAB_0025d364;
        if (status.ContinueInvoked != false) {
          cVar4 = '\x04';
          goto LAB_0025d369;
        }
        if (status.ExitCode.super__Optional_base<int,_true,_true>._M_payload.
            super__Optional_payload_base<int>._M_engaged == true) {
          (local_1f0->ExitCode).super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int> =
               (_Optional_payload_base<int>)
               ((ulong)(uint)status.ExitCode.super__Optional_base<int,_true,_true>._M_payload.
                             super__Optional_payload_base<int>._M_payload._M_value | 0x100000000);
          goto LAB_0025d364;
        }
        cVar4 = cmSystemTools::GetFatalErrorOccurred();
        bVar3 = !(bool)cVar4;
      }
      cmExecutionStatus::~cmExecutionStatus(&status);
      lff = lff + 1;
    } while (bVar3);
  } while (cVar4 == '\x04');
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&conditionEvaluator.Backtrace.
              super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
LAB_0025d57b:
  std::__cxx11::string::~string((string *)&errorString);
  std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::~vector
            (&expandedArguments);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&whileBT.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return true;
}

Assistant:

bool cmWhileFunctionBlocker::Replay(std::vector<cmListFileFunction> functions,
                                    cmExecutionStatus& inStatus)
{
  auto& mf = inStatus.GetMakefile();

  cmListFileBacktrace whileBT =
    mf.GetBacktrace().Push(this->GetStartingContext());

  std::vector<cmExpandedCommandArgument> expandedArguments;
  // At least same size expected for `expandedArguments` as `Args`
  expandedArguments.reserve(this->Args.size());

  auto expandArgs = [&mf](std::vector<cmListFileArgument> const& args,
                          std::vector<cmExpandedCommandArgument>& out)
    -> std::vector<cmExpandedCommandArgument>& {
    out.clear();
    mf.ExpandArguments(args, out);
    return out;
  };

  // For compatibility with projects that do not set CMP0130 to NEW,
  // we tolerate condition errors that evaluate to false.
  bool enforceError = true;
  std::string errorString;
  MessageType messageType;

  for (cmConditionEvaluator conditionEvaluator(mf, whileBT);
       (enforceError = /* enforce condition errors that evaluate to true */
        conditionEvaluator.IsTrue(expandArgs(this->Args, expandedArguments),
                                  errorString, messageType));) {
    // Invoke all the functions that were collected in the block.
    for (cmListFileFunction const& fn : functions) {
      cmExecutionStatus status(mf);
      mf.ExecuteCommand(fn, status);
      if (status.GetReturnInvoked()) {
        inStatus.SetReturnInvoked(status.GetReturnVariables());
        return true;
      }
      if (status.GetBreakInvoked()) {
        return true;
      }
      if (status.GetContinueInvoked()) {
        break;
      }
      if (status.HasExitCode()) {
        inStatus.SetExitCode(status.GetExitCode());
        return true;
      }
      if (cmSystemTools::GetFatalErrorOccurred()) {
        return true;
      }
    }
  }

  if (!errorString.empty() && !enforceError) {
    // This error should only be enforced if CMP0130 is NEW.
    switch (mf.GetPolicyStatus(cmPolicies::CMP0130)) {
      case cmPolicies::WARN:
        // Convert the error to a warning and enforce it.
        messageType = MessageType::AUTHOR_WARNING;
        enforceError = true;
        break;
      case cmPolicies::OLD:
        // OLD behavior is to silently ignore the error.
        break;
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::NEW:
        // NEW behavior is to enforce the error.
        enforceError = true;
        break;
    }
  }

  if (!errorString.empty() && enforceError) {
    std::string err = "while() given incorrect arguments:\n ";
    for (auto const& i : expandedArguments) {
      err += " ";
      err += cmOutputConverter::EscapeForCMake(i.GetValue());
    }
    err += "\n";
    err += errorString;
    if (mf.GetPolicyStatus(cmPolicies::CMP0130) == cmPolicies::WARN) {
      err =
        cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0130), '\n', err);
    }
    mf.GetCMakeInstance()->IssueMessage(messageType, err, whileBT);
    if (messageType == MessageType::FATAL_ERROR) {
      cmSystemTools::SetFatalErrorOccurred();
    }
  }

  return true;
}